

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O2

int find_str(char *a,char *b,int lena,int lenb)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (lena - lenb < lVar2) {
      return -1;
    }
    bVar1 = bincmp(a + lVar2,b,lenb);
    if (bVar1) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int find_str(char* a, const char* b,int lena,int lenb) {
	for (int i = 0; i < lena - lenb+1; i++)
	{
		if (bincmp(a + i, b, lenb))
			return i;
	}

	return -1;
}